

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlsave(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlsave : 9 of 15 functions ...\n");
  }
  iVar1 = test_xmlSaveClose();
  iVar2 = test_xmlSaveDoc();
  iVar3 = test_xmlSaveFinish();
  iVar4 = test_xmlSaveFlush();
  iVar5 = test_xmlSaveSetAttrEscape();
  iVar6 = test_xmlSaveSetEscape();
  iVar7 = test_xmlSaveSetIndentString();
  iVar8 = test_xmlSaveToBuffer();
  iVar9 = test_xmlSaveToFd();
  iVar10 = test_xmlSaveToFilename();
  iVar11 = test_xmlSaveTree();
  iVar12 = test_xmlThrDefIndentTreeOutput();
  iVar13 = test_xmlThrDefSaveNoEmptyTags();
  iVar14 = test_xmlThrDefTreeIndentString();
  uVar15 = iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar15 != 0) {
    printf("Module xmlsave: %d errors\n",(ulong)uVar15);
  }
  return uVar15;
}

Assistant:

static int
test_xmlsave(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlsave : 9 of 15 functions ...\n");
    test_ret += test_xmlSaveClose();
    test_ret += test_xmlSaveDoc();
    test_ret += test_xmlSaveFinish();
    test_ret += test_xmlSaveFlush();
    test_ret += test_xmlSaveSetAttrEscape();
    test_ret += test_xmlSaveSetEscape();
    test_ret += test_xmlSaveSetIndentString();
    test_ret += test_xmlSaveToBuffer();
    test_ret += test_xmlSaveToFd();
    test_ret += test_xmlSaveToFilename();
    test_ret += test_xmlSaveTree();
    test_ret += test_xmlThrDefIndentTreeOutput();
    test_ret += test_xmlThrDefSaveNoEmptyTags();
    test_ret += test_xmlThrDefTreeIndentString();

    if (test_ret != 0)
	printf("Module xmlsave: %d errors\n", test_ret);
    return(test_ret);
}